

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteKvIoPageDontWrite(unqlite_page *pPage)

{
  if ((pPage != (unqlite_page *)0x0) && (pPage->iPage != 0)) {
    *(byte *)&pPage[1].pUserData = *(byte *)&pPage[1].pUserData | 8;
  }
  return 0;
}

Assistant:

static int unqliteKvIoPageDontWrite(unqlite_page *pPage)
{
	int rc;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	rc = unqlitePagerDontWrite(pPage);
	return rc;
}